

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

void Bac_NtkAlloc(Bac_Ntk_t *pNew,int NameId,int nIns,int nOuts,int nObjs)

{
  Abc_Nam_t *p;
  int iVar1;
  int iVar2;
  char *pcVar3;
  int local_28;
  int local_24;
  int fFound;
  int NtkId;
  int nObjs_local;
  int nOuts_local;
  int nIns_local;
  int NameId_local;
  Bac_Ntk_t *pNew_local;
  
  fFound = nObjs;
  NtkId = nOuts;
  nObjs_local = nIns;
  nOuts_local = NameId;
  _nIns_local = pNew;
  if (pNew->pDesign == (Bac_Man_t *)0x0) {
    __assert_fail("pNew->pDesign != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
  }
  iVar1 = Bac_NtkPiNum(pNew);
  if (iVar1 != 0) {
    __assert_fail("Bac_NtkPiNum(pNew) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
  }
  iVar1 = Bac_NtkPoNum(_nIns_local);
  if (iVar1 != 0) {
    __assert_fail("Bac_NtkPoNum(pNew) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
  }
  _nIns_local->NameId = nOuts_local;
  _nIns_local->iCopy = -1;
  _nIns_local->iBoxNtk = -1;
  _nIns_local->iBoxObj = -1;
  Vec_IntGrow(&_nIns_local->vInputs,nObjs_local);
  Vec_IntGrow(&_nIns_local->vOutputs,NtkId);
  Vec_StrGrow(&_nIns_local->vType,fFound);
  Vec_IntGrow(&_nIns_local->vFanin,fFound);
  p = _nIns_local->pDesign->pMods;
  pcVar3 = Bac_NtkStr(_nIns_local,nOuts_local);
  iVar1 = Abc_NamStrFindOrAdd(p,pcVar3,&local_28);
  local_24 = iVar1;
  if (local_28 == 0) {
    iVar2 = Bac_NtkId(_nIns_local);
    if (iVar1 != iVar2) {
      __assert_fail("NtkId == Bac_NtkId(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
  }
  else {
    pcVar3 = Bac_NtkStr(_nIns_local,nOuts_local);
    printf("Network with name %s already exists.\n",pcVar3);
  }
  return;
}

Assistant:

static inline void Bac_NtkAlloc( Bac_Ntk_t * pNew, int NameId, int nIns, int nOuts, int nObjs )
{
    int NtkId, fFound;
    assert( pNew->pDesign != NULL );
    assert( Bac_NtkPiNum(pNew) == 0 );
    assert( Bac_NtkPoNum(pNew) == 0 );
    pNew->NameId  = NameId;
    pNew->iCopy   = -1;
    pNew->iBoxNtk = -1;
    pNew->iBoxObj = -1;
    Vec_IntGrow( &pNew->vInputs,  nIns );
    Vec_IntGrow( &pNew->vOutputs, nOuts );
    Vec_StrGrow( &pNew->vType,    nObjs );
    Vec_IntGrow( &pNew->vFanin,   nObjs );
    // check if the network is unique
    NtkId = Abc_NamStrFindOrAdd( pNew->pDesign->pMods, Bac_NtkStr(pNew, NameId), &fFound );
    if ( fFound )
        printf( "Network with name %s already exists.\n", Bac_NtkStr(pNew, NameId) );
    else
        assert( NtkId == Bac_NtkId(pNew) );
}